

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void iidentity16_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  byte bVar4;
  undefined1 in_XMM0 [16];
  undefined1 auVar5 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i clamp_hi;
  __m128i clamp_lo;
  
  lVar3 = 0;
  auVar5 = pmovsxwq(in_XMM0,0x2d422d42);
  auVar6 = pmovsxwq(in_XMM1,0x8000800);
  for (; lVar3 != 0x100; lVar3 = lVar3 + 0x10) {
    auVar7 = *(undefined1 (*) [16])((long)*in + lVar3);
    auVar9._4_4_ = auVar7._4_4_;
    auVar9._0_4_ = auVar7._4_4_;
    auVar9._8_4_ = auVar7._12_4_;
    auVar9._12_4_ = auVar7._12_4_;
    auVar7 = pmuldq(auVar7,auVar5);
    auVar8._0_8_ = CONCAT44(auVar7._4_4_ + auVar6._4_4_,auVar7._0_4_ + auVar6._0_4_);
    auVar8._8_4_ = auVar7._8_4_ + auVar6._8_4_;
    auVar8._12_4_ = auVar7._12_4_ + auVar6._12_4_;
    auVar7 = pmuldq(auVar9,auVar5);
    auVar10._0_8_ = CONCAT44(auVar7._4_4_ + auVar6._4_4_,auVar7._0_4_ + auVar6._0_4_);
    auVar10._8_4_ = auVar7._8_4_ + auVar6._8_4_;
    auVar10._12_4_ = auVar7._12_4_ + auVar6._12_4_;
    puVar1 = (undefined8 *)((long)*out + lVar3);
    *puVar1 = CONCAT44((int)(auVar10._0_8_ >> 0xc),(int)(auVar8._0_8_ >> 0xc));
    puVar1[1] = CONCAT44((int)(auVar10._8_8_ >> 0xc),(int)(auVar8._8_8_ >> 0xc));
  }
  if (do_cols == 0) {
    bVar4 = 10;
    if (10 < bd) {
      bVar4 = (byte)bd;
    }
    iVar2 = 0x20 << (bVar4 & 0x1f);
    clamp_lo[0]._0_4_ = -iVar2;
    clamp_hi[0]._0_4_ = iVar2 + -1;
    clamp_hi[0]._4_4_ = (int)clamp_hi[0];
    clamp_hi[1]._0_4_ = (int)clamp_hi[0];
    clamp_hi[1]._4_4_ = (int)clamp_hi[0];
    clamp_lo[0]._4_4_ = (int)clamp_lo[0];
    clamp_lo[1]._0_4_ = (int)clamp_lo[0];
    clamp_lo[1]._4_4_ = (int)clamp_lo[0];
    round_shift_8x8(out,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,&clamp_lo,&clamp_hi,0x10);
  }
  return;
}

Assistant:

static void iidentity16_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  (void)bit;
  __m128i fact = _mm_set1_epi32(2 * NewSqrt2);
  __m128i offset = _mm_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m128i a0_low, a0_high, a1_low, a1_high;
  __m128i zero = _mm_setzero_si128();
  offset = _mm_unpacklo_epi32(offset, zero);

  for (int i = 0; i < 16; i++) {
    a0_low = _mm_mul_epi32(in[i], fact);
    a0_low = _mm_add_epi32(a0_low, offset);
    a0_low = _mm_srli_epi64(a0_low, NewSqrt2Bits);

    a0_high = _mm_srli_si128(in[i], 4);
    a0_high = _mm_mul_epi32(a0_high, fact);
    a0_high = _mm_add_epi32(a0_high, offset);
    a0_high = _mm_srli_epi64(a0_high, NewSqrt2Bits);

    a1_low = _mm_unpacklo_epi32(a0_low, a0_high);
    a1_high = _mm_unpackhi_epi32(a0_low, a0_high);
    out[i] = _mm_unpacklo_epi64(a1_low, a1_high);
  }

  if (!do_cols) {
    const int log_range = AOMMAX(16, bd + 6);
    const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
    const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo, &clamp_hi, 16);
  }
}